

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

llama_kv_cache_view * llama_kv_cache_view_init(llama_context *ctx,int32_t n_seq_max)

{
  llama_kv_cache *plVar1;
  undefined4 in_EDX;
  llama_kv_cache_view *in_RDI;
  llama_kv_cache *kv;
  undefined4 in_stack_fffffffffffffff0;
  
  plVar1 = llama_context::get_kv_self((llama_context *)0x3e1520);
  if (plVar1 == (llama_kv_cache *)0x0) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: the context does not have a KV cache\n",
                       "llama_kv_cache_view_init");
    memset(in_RDI,0,0x28);
  }
  else {
    llama_kv_cache_view_init
              ((llama_kv_cache *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),
               (int32_t)((ulong)plVar1 >> 0x20));
  }
  return in_RDI;
}

Assistant:

llama_kv_cache_view llama_kv_cache_view_init(const llama_context * ctx, int32_t n_seq_max) {
    const auto * kv = ctx->get_kv_self();
    if (kv == nullptr) {
        LLAMA_LOG_WARN("%s: the context does not have a KV cache\n", __func__);
        return {};
    }

    return llama_kv_cache_view_init(*kv, n_seq_max);
}